

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O1

int handle_subfield(FFSBuffer buf,FMFormat_conflict f,estate s,size_t data_offset,
                   size_t parent_offset,FMTypeDesc *t)

{
  cod_exec_context ec;
  internal_iovec *piVar1;
  field_marshal_info_conflict pfVar2;
  int iVar3;
  uint tmp;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  size_t sVar8;
  void *pvVar9;
  addr_list_entry *paVar10;
  uint *data;
  int extraout_EDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  long lVar11;
  FMTypeDesc *pFVar12;
  uint uVar13;
  FMTypeDesc *next;
  char *unaff_R14;
  bool bVar14;
  size_t tmp_data_loc;
  subsample_marshal_data smd;
  size_t local_78;
  ulong local_70;
  field_marshal_info_conflict local_68;
  size_t local_60;
  undefined1 local_58 [16];
  uint *local_48;
  long local_40;
  int local_38;
  
  data = &switchD_0010eed9::switchdataD_0013a040;
  switch(t->type) {
  case FMType_pointer:
    uVar13 = f->pointer_size - 1;
    if (uVar13 < 8) {
      pvVar9 = buf->tmp_buffer;
      data = &switchD_0010eefd::switchdataD_0013a090;
      switch(uVar13) {
      case 0:
        data = (uint *)(ulong)*(byte *)((long)pvVar9 + data_offset);
        break;
      case 1:
        data = (uint *)(ulong)*(ushort *)((long)pvVar9 + data_offset);
        break;
      case 3:
        data = (uint *)(ulong)*(uint *)((long)pvVar9 + data_offset);
        break;
      case 7:
        data = *(uint **)((long)pvVar9 + data_offset);
      }
    }
    if (data == (uint *)0x0) {
      return 1;
    }
    local_68 = get_marshal_info(f,t);
    if (((local_68 != (field_marshal_info_conflict)0x0) && (local_68->type == FFSDropField)) &&
       (iVar4 = (*local_68->drop_row_func)(s->orig_data), iVar4 != 0)) {
      if (7 < uVar13) {
        return 1;
      }
      pvVar9 = buf->tmp_buffer;
      switch(uVar13) {
      case 0:
        goto switchD_0010f167_caseD_0;
      case 1:
switchD_0010f167_caseD_1:
        *(undefined2 *)((long)pvVar9 + data_offset) = 0;
        return 1;
      default:
        return 1;
      case 3:
switchD_0010f167_caseD_3:
        *(undefined4 *)((long)pvVar9 + data_offset) = 0;
        return 1;
      case 7:
switchD_0010f167_caseD_7:
        *(undefined8 *)((long)pvVar9 + data_offset) = 0;
        return 1;
      }
    }
    if (f->recursive != 0) {
      if ((long)s->addr_list_cnt < 1) {
        lVar7 = -1;
      }
      else {
        lVar7 = -1;
        lVar11 = 0;
        do {
          if (*(uint **)((long)&s->addr_list->addr + lVar11) == data) {
            lVar7 = *(long *)((long)&s->addr_list->offset + lVar11);
          }
          lVar11 = lVar11 + 0x10;
        } while ((long)s->addr_list_cnt * 0x10 != lVar11);
      }
      if (lVar7 != -1) {
        if (7 < uVar13) {
          return 1;
        }
        pvVar9 = buf->tmp_buffer;
        switch(uVar13) {
        case 0:
          *(char *)((long)pvVar9 + data_offset) = (char)lVar7;
          return 1;
        case 1:
          *(short *)((long)pvVar9 + data_offset) = (short)lVar7;
          return 1;
        default:
          return 1;
        case 3:
          *(int *)((long)pvVar9 + data_offset) = (int)lVar7;
          return 1;
        case 7:
          *(long *)((long)pvVar9 + data_offset) = lVar7;
          return 1;
        }
      }
    }
    pFVar12 = t->next;
    sVar6 = determine_size(f,buf,parent_offset,pFVar12);
    pfVar2 = local_68;
    if (sVar6 != 0) {
      if ((local_68 == (field_marshal_info_conflict)0x0) ||
         (local_68->type != FFSSubsampleArrayField)) {
        pvVar9 = extraout_RDX;
        if ((s->copy_all == 0) &&
           (iVar4 = field_is_flat(f,pFVar12), pvVar9 = extraout_RDX_00, iVar4 != 0)) {
          sVar6 = add_data_iovec(s,(FFSBuffer)pFVar12,data,sVar6,8);
        }
        else if (s->no_leaf_copy == 0) {
          sVar6 = copy_data_to_tmp(s,buf,data,sVar6,8,&local_78);
        }
        else {
          sVar6 = reserve_space_for_data_in_tmp(s,buf,pvVar9,sVar6,8,&local_78);
        }
      }
      else {
        sVar8 = determine_size(f,buf,parent_offset,pFVar12->next);
        local_70 = sVar6 / sVar8;
        ec = pfVar2->ec;
        local_60 = allocate_tmp_space(s,buf,sVar6,8,&local_78);
        local_58._0_4_ = (int)local_70;
        local_40 = local_60 + (long)buf->tmp_buffer;
        local_38 = 0;
        local_58._8_8_ = sVar8;
        local_48 = data;
        cod_assoc_client_data(ec,0x534d4450,(intptr_t)local_58);
        (*local_68->subsample_array_func)(ec,s->orig_data,(int)local_70);
        set_dynamic_array_size(f,buf,parent_offset,t->next,local_38);
        piVar1 = s->iovec;
        iVar4 = s->iovcnt;
        piVar1[iVar4].iov_len = (long)local_38 * sVar8;
        piVar1[iVar4].iov_offset = local_78;
        piVar1[iVar4].iov_base = (void *)0x0;
        s->iovcnt = iVar4 + 1;
        lVar7 = (long)local_38 * sVar8 - sVar6;
        s->output_len = s->output_len + lVar7;
        buf->tmp_buffer_in_use_size = buf->tmp_buffer_in_use_size + lVar7;
        sVar6 = local_60;
      }
      if (uVar13 < 8) {
        lVar7 = sVar6 - s->saved_offset_difference;
        pvVar9 = buf->tmp_buffer;
        switch(uVar13) {
        case 0:
          *(char *)((long)pvVar9 + data_offset) = (char)lVar7;
          break;
        case 1:
          *(short *)((long)pvVar9 + data_offset) = (short)lVar7;
          break;
        case 3:
          *(int *)((long)pvVar9 + data_offset) = (int)lVar7;
          break;
        case 7:
          *(long *)((long)pvVar9 + data_offset) = lVar7;
        }
      }
      if (f->recursive != 0) {
        lVar7 = s->saved_offset_difference;
        if (s->addr_list_is_stack == 0) {
          lVar11 = s->malloc_addr_size;
          if (lVar11 == s->addr_list_cnt) {
            s->malloc_addr_size = lVar11 * 2;
            paVar10 = (addr_list_entry *)ffs_realloc(s->addr_list,lVar11 << 5);
            s->addr_list = paVar10;
          }
        }
        else if (s->addr_list_cnt == 100) {
          s->addr_list_is_stack = 0;
          s->malloc_addr_size = 200;
          paVar10 = (addr_list_entry *)ffs_malloc(0xc80);
          memcpy(paVar10,s->addr_list,0x640);
          s->addr_list = paVar10;
        }
        paVar10 = s->addr_list;
        iVar4 = s->addr_list_cnt;
        paVar10[iVar4].addr = data;
        paVar10[iVar4].offset = sVar6 - lVar7;
        s->addr_list_cnt = iVar4 + 1;
      }
      pFVar12 = t->next;
      iVar4 = field_is_flat(f,pFVar12);
      if (iVar4 == 0) {
        iVar4 = handle_subfield(buf,f,s,local_78,parent_offset,pFVar12);
        return iVar4;
      }
      return 1;
    }
    if (7 < uVar13) {
      return 1;
    }
    pvVar9 = buf->tmp_buffer;
    switch(uVar13) {
    case 0:
switchD_0010f167_caseD_0:
      *(undefined1 *)((long)pvVar9 + data_offset) = 0;
      return 1;
    case 1:
      goto switchD_0010f167_caseD_1;
    default:
      return 1;
    case 3:
      goto switchD_0010f167_caseD_3;
    case 7:
      goto switchD_0010f167_caseD_7;
    }
  case FMType_array:
    lVar7 = 1;
    if (t->type == FMType_array) {
      do {
        sVar6 = (size_t)t->static_size;
        if (sVar6 == 0) {
          local_48 = (uint *)0x0;
          local_58._12_4_ = 0;
          local_58._8_4_ = f->field_list[t->control_field_index].field_size;
          local_58._0_8_ = SEXT48(f->field_list[t->control_field_index].field_offset);
          sVar6 = quick_get_ulong((FMFieldPtr)local_58,
                                  (void *)((long)buf->tmp_buffer + parent_offset));
        }
        lVar7 = lVar7 * sVar6;
        t = t->next;
      } while (t->type == FMType_array);
    }
    sVar6 = determine_size(f,buf,parent_offset,t);
    iVar4 = field_is_flat(f,t);
    if (iVar4 == 0) {
      iVar4 = 0;
      if (lVar7 == 0) {
        bVar14 = false;
      }
      else {
        do {
          lVar7 = lVar7 + -1;
          iVar4 = handle_subfield(buf,f,s,data_offset,parent_offset,t);
          bVar14 = iVar4 == 0;
          if (bVar14) break;
          data_offset = data_offset + sVar6;
        } while (lVar7 != 0);
        iVar4 = 0;
      }
    }
    else {
      iVar4 = 1;
      bVar14 = true;
    }
    if (bVar14) {
      return iVar4;
    }
    break;
  case FMType_string:
    uVar13 = f->pointer_size - 1;
    if (uVar13 < 8) {
      pvVar9 = buf->tmp_buffer;
      switch(uVar13) {
      case 0:
        unaff_R14 = (char *)(ulong)*(byte *)((long)pvVar9 + data_offset);
        break;
      case 1:
        unaff_R14 = (char *)(ulong)*(ushort *)((long)pvVar9 + data_offset);
        break;
      case 3:
        unaff_R14 = (char *)(ulong)*(uint *)((long)pvVar9 + data_offset);
        break;
      case 7:
        unaff_R14 = *(char **)((long)pvVar9 + data_offset);
      }
    }
    bVar14 = true;
    if (unaff_R14 == (char *)0x0) {
      iVar4 = 1;
    }
    else {
      sVar5 = strlen(unaff_R14);
      if (s->copy_all == 0) {
        sVar6 = add_data_iovec(s,(FFSBuffer)f,unaff_R14,sVar5 + 1,1);
        iVar3 = extraout_EDX;
      }
      else {
        sVar6 = copy_data_to_tmp(s,buf,unaff_R14,sVar5 + 1,1,(size_t *)0x0);
        iVar4 = 0;
        iVar3 = 0;
        if (sVar6 == 0xffffffffffffffff) goto switchD_0010f0ed_caseD_2;
      }
      iVar4 = iVar3;
      bVar14 = false;
      if (uVar13 < 8) {
        lVar7 = sVar6 - s->saved_offset_difference;
        pvVar9 = buf->tmp_buffer;
        iVar4 = 0x13a070;
        bVar14 = false;
        switch(uVar13) {
        case 0:
          *(char *)((long)pvVar9 + data_offset) = (char)lVar7;
          break;
        case 1:
          *(short *)((long)pvVar9 + data_offset) = (short)lVar7;
          break;
        default:
          goto switchD_0010f0ed_caseD_2;
        case 3:
          *(int *)((long)pvVar9 + data_offset) = (int)lVar7;
          break;
        case 7:
          *(long *)((long)pvVar9 + data_offset) = lVar7;
        }
        bVar14 = false;
      }
    }
switchD_0010f0ed_caseD_2:
    if (bVar14) {
      return iVar4;
    }
    break;
  case FMType_subformat:
    iVar4 = handle_subfields(buf,f->field_subformats[t->field_index],s,data_offset);
    return iVar4;
  }
  return 1;
}

Assistant:

static int
handle_subfield(FFSBuffer buf, FMFormat f, estate s, size_t data_offset, size_t parent_offset, FMTypeDesc *t)
{

    switch (t->type) {
    case FMType_pointer:
    {
	struct _FMgetFieldStruct src_spec;
	size_t size, new_offset, tmp_data_loc;
	char *ptr_value;
	field_marshal_info marshal_info;

	memset(&src_spec, 0, sizeof(src_spec));
	src_spec.size = f->pointer_size;
	ptr_value = quick_get_pointer(&src_spec, (char*)buf->tmp_buffer + data_offset);
	if (ptr_value == NULL) return 1;

	/* customized marshalling */
	if ((marshal_info = get_marshal_info(f, t)) != NULL) {
	    if (marshal_info->type == FFSDropField) {
		if (marshal_info->drop_row_func(s->orig_data)) {
		    /* drop the value */
		    quick_put_ulong(&src_spec, 0,
				    (char*)buf->tmp_buffer + data_offset);
		    return 1;
		}
	    }
	}

	if (f->recursive) {
	    ssize_t previous_offset = search_addr_list(s, ptr_value);
	    if (previous_offset != (ssize_t)-1) {
		quick_put_ulong(&src_spec, previous_offset,
				(char*)buf->tmp_buffer + data_offset);
		return 1;
	    }
	}
	size = determine_size(f, buf, parent_offset, t->next);
	if (size == 0)  {
	    quick_put_ulong(&src_spec, 0,
			    (char*)buf->tmp_buffer + data_offset);
	    return 1;
	}
	if ((marshal_info == NULL) || (marshal_info->type != FFSSubsampleArrayField)) {
	    if (!s->copy_all && field_is_flat(f, t->next)) {
		/* leave data where it sits */
		new_offset = add_data_iovec(s, buf, ptr_value, size, 8);
	    } else {
		if (s->no_leaf_copy) {
		    /* this path only used for FFSencode_no_leaf_copy() */
		    new_offset = reserve_space_for_data_in_tmp(s, buf, ptr_value, size, 8, &tmp_data_loc);
		} else {
		    new_offset = copy_data_to_tmp(s, buf, ptr_value, size, 8, &tmp_data_loc);
		}
	    }
	} else {
	    /* can't leave data where it sits */
	    /* 1. allocate temporary space for the destination array
	       2. call function to fill destination with part of source
	       3. return value is number of elements copied
	       4. adjust size of temporary to reflect actual data copied
	    */
	    size_t element_size = determine_size(f, buf, parent_offset, t->next->next);
	    size_t element_count = size / element_size;
	    cod_exec_context ec = marshal_info->ec;
	    struct subsample_marshal_data smd;
	    new_offset = allocate_tmp_space(s, buf, size, 8, &tmp_data_loc);
	    smd.element_count = (int)element_count;
	    smd.element_size = element_size;
	    smd.src_ptr = ptr_value;
	    smd.dst_ptr = (char*)buf->tmp_buffer + new_offset;
	    smd.marshalled_count = 0;
#ifdef DO_DCG
	    cod_assoc_client_data(ec,  0x534d4450, (intptr_t)&smd);
#endif
	    marshal_info->subsample_array_func(ec, s->orig_data, (int)element_count);
	    /* fixup size */
	    set_dynamic_array_size(f, buf, parent_offset, t->next, 
				   smd.marshalled_count);
	    if (size != 0) {
		s->iovec[s->iovcnt].iov_len = smd.marshalled_count * element_size;
		s->iovec[s->iovcnt].iov_offset = tmp_data_loc;
		s->iovec[s->iovcnt].iov_base = NULL;
		s->iovcnt++;
	    }
	    s->output_len -= (size - (smd.marshalled_count *element_size));
	    buf->tmp_buffer_in_use_size -= (size - (smd.marshalled_count *element_size));
	}
	quick_put_ulong(&src_spec, new_offset - s->saved_offset_difference, 
			(char*)buf->tmp_buffer + data_offset);
	if (f->recursive) {
	    add_to_addr_list(s, ptr_value, new_offset - s->saved_offset_difference);
	}
	if (field_is_flat(f, t->next)) return 1;
	return handle_subfield(buf, f, s, tmp_data_loc, parent_offset, t->next);
    }
    case FMType_string:
    {
	struct _FMgetFieldStruct src_spec;
	char *ptr_value;
	size_t size, str_offset;
	memset(&src_spec, 0, sizeof(src_spec));
	src_spec.size = f->pointer_size;
	ptr_value = quick_get_pointer(&src_spec, (char*)buf->tmp_buffer + data_offset);
	if (ptr_value == NULL) return 1;
	size = strlen(ptr_value) + 1;
	if (!s->copy_all) {
	    /* leave data where it sits */
	    str_offset = add_data_iovec(s, buf, ptr_value, size, 1);
	} else {
	    str_offset = copy_data_to_tmp(s, buf, ptr_value, size, 1, NULL);
	    if (str_offset == (size_t) -1) return 0;
	}
	quick_put_ulong(&src_spec, str_offset - s->saved_offset_difference,
			(char*)buf->tmp_buffer + data_offset);
	break;
    }
    case FMType_array:
    {
	size_t elements = 1, i;
	size_t element_size;
	FMTypeDesc *next = t;
	while (next->type == FMType_array) {
	    if (next->static_size == 0) {
		struct _FMgetFieldStruct src_spec;
		int field = next->control_field_index;
		memset(&src_spec, 0, sizeof(src_spec));
		src_spec.size = f->field_list[field].field_size;
		src_spec.offset = f->field_list[field].field_offset;
		size_t tmp = quick_get_ulong(&src_spec, (char*)buf->tmp_buffer + parent_offset);
		elements = elements * tmp;
	    } else {
		elements = elements * next->static_size;
	    }
	    next = next->next;
	}
	element_size = determine_size(f, buf, parent_offset, next);
	if (field_is_flat(f, next)) return 1;
	for (i = 0; i < elements ; i++) {
	    size_t element_offset = data_offset + i * element_size;
	    if (!handle_subfield(buf, f, s, element_offset, parent_offset, next)) return 0;
	}
	break;
    }
    case FMType_subformat:
    {
	int field_index = t->field_index;
	FMFormat subformat = f->field_subformats[field_index];
	return handle_subfields(buf, subformat, s, data_offset);
    }
    default:
	assert(0);
    }
    return 1;
}